

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

qpdf_error qpdf_next_warning(qpdf_data qpdf)

{
  QPDF_BOOL QVar1;
  undefined1 local_28 [24];
  qpdf_data qpdf_local;
  
  local_28._16_8_ = qpdf;
  QVar1 = qpdf_more_warnings(qpdf);
  if (QVar1 == 0) {
    qpdf_local = (qpdf_data)0x0;
  }
  else {
    std::__cxx11::list<QPDFExc,_std::allocator<QPDFExc>_>::front
              ((list<QPDFExc,_std::allocator<QPDFExc>_> *)(local_28._16_8_ + 0x40));
    std::make_shared<QPDFExc,QPDFExc&>((QPDFExc *)local_28);
    std::shared_ptr<QPDFExc>::operator=
              ((shared_ptr<QPDFExc> *)(local_28._16_8_ + 0x30),(shared_ptr<QPDFExc> *)local_28);
    std::shared_ptr<QPDFExc>::~shared_ptr((shared_ptr<QPDFExc> *)local_28);
    std::__cxx11::list<QPDFExc,_std::allocator<QPDFExc>_>::pop_front
              ((list<QPDFExc,_std::allocator<QPDFExc>_> *)(local_28._16_8_ + 0x40));
    QTC::TC("qpdf","qpdf-c qpdf_next_warning returned warning",0);
    qpdf_local = (qpdf_data)(local_28._16_8_ + 0x30);
  }
  return (qpdf_error)qpdf_local;
}

Assistant:

qpdf_error
qpdf_next_warning(qpdf_data qpdf)
{
    if (qpdf_more_warnings(qpdf)) {
        qpdf->tmp_error.exc = std::make_shared<QPDFExc>(qpdf->warnings.front());
        qpdf->warnings.pop_front();
        QTC::TC("qpdf", "qpdf-c qpdf_next_warning returned warning");
        return &qpdf->tmp_error;
    } else {
        return nullptr;
    }
}